

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::init
          (TransformFeedbackCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pSVar1;
  pointer *pppAVar2;
  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  *this_00;
  anon_struct_8_2_bfd9d0cb_for_basic varyingName;
  StructType *pSVar3;
  deUint32 dVar4;
  Interpolation IVar5;
  GLuint GVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  TransformFeedback *pTVar8;
  value_type *pvVar9;
  pointer pcVar10;
  pointer pOVar11;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Varying_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>_>
  __last;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var12;
  iterator iVar13;
  iterator iVar14;
  GLuint *pGVar15;
  void *pvVar16;
  Functions *pFVar17;
  bool bVar18;
  int iVar19;
  GLenum GVar20;
  DataType dataType;
  int extraout_EAX;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var21;
  ostream *poVar22;
  ostream *poVar23;
  size_t sVar24;
  ShaderProgram *pSVar25;
  long *plVar26;
  pointer pbVar27;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Varying_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>_>
  _Var28;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var29;
  ObjectWrapper *this_01;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  NotSupportedError *this_02;
  undefined8 uVar30;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarTypeComponent *pVVar31;
  char *nameWithPath;
  pointer ppSVar32;
  char *pcVar33;
  long lVar34;
  pointer pVVar35;
  pointer pOVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  pointer_____offset_0x10___ *ppuVar38;
  undefined1 auVar39 [8];
  anon_struct_8_2_bfd9d0cb_for_basic in_R8;
  int iVar40;
  char *pcVar41;
  GLuint GVar42;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cur;
  value_type *__x;
  VectorTypeIterator vecIter;
  VectorTypeIterator vecIter_1;
  string attribName;
  VarType subType;
  VarType attribType;
  string fragSource;
  TypeComponentVector varPath;
  GLenum type;
  string vertSource;
  TypeComponentVector fullPath;
  ostringstream frag;
  Attribute *attrib;
  ostringstream vtx;
  string local_4f8;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0 [2];
  undefined1 local_490 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  allocator<char> local_469;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [24];
  undefined1 local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  Functions *local_420;
  pointer local_418;
  long local_410;
  undefined1 local_408 [32];
  long local_3e8;
  deUint32 local_3d8;
  undefined4 uStack_3d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  undefined1 local_3c8 [24];
  pointer local_3b0;
  deUint32 local_3a8;
  deUint32 local_3a4;
  string local_3a0;
  undefined1 local_380 [17];
  undefined7 uStack_36f;
  pointer local_368;
  ProgramSpec *local_360;
  vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> local_358;
  undefined1 local_340 [8];
  undefined1 auStack_338 [8];
  undefined1 local_330 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_328 [2];
  ios_base local_2d0 [264];
  RenderContext *local_1c8;
  Attribute *local_1c0;
  undefined1 local_1b8 [8];
  pointer pbStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  VarType local_198 [3];
  ios_base local_148 [8];
  ios_base local_140 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_128;
  deUint32 local_110;
  undefined1 local_108 [216];
  
  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_420 = (Functions *)CONCAT44(extraout_var,iVar19);
  local_1c8 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3a4 = this->m_bufferMode;
  dVar4 = this->m_primitiveType;
  local_380._0_8_ = local_380 + 0x10;
  local_380._8_8_ = (pointer)0x0;
  local_380[0x10] = 0;
  local_418 = (pointer)local_408;
  local_410 = 0;
  local_408._0_8_ = local_408._0_8_ & 0xffffffffffffff00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  local_3a8 = dVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
  _Var21 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[13]>>
                     ((this->m_progSpec).m_transformFeedbackVaryings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_progSpec).m_transformFeedbackVaryings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,"gl_PointSize");
  pbVar7 = (this->m_progSpec).m_transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"uniform highp vec4 u_scale;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"uniform highp vec4 u_bias;\n",0x1b);
  if (_Var21._M_current != pbVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"in highp float a_pointSize;\n",0x1c);
  }
  pVVar35 = (this->m_progSpec).m_varyings.
            super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
            ._M_impl.super__Vector_impl_data._M_start;
  _local_3d8 = pbVar7;
  local_3d0 = _Var21._M_current;
  if (pVVar35 !=
      (this->m_progSpec).m_varyings.
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pTVar8 = (TransformFeedback *)(pVVar35->name)._M_dataplus._M_p;
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)&local_4f8,&pVVar35->type);
      while( true ) {
        local_4c8._0_8_ = (VarTypeComponent *)0x0;
        local_4c8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_4d8._0_8_ = (StructType *)0x0;
        local_4d8._8_4_ = TYPE_INVALID;
        local_4d8._12_4_ = PRECISION_LOWP;
        bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                           ((SubTypeIterator<glu::IsVectorOrScalarType> *)&local_4f8,
                            (SubTypeIterator<glu::IsVectorOrScalarType> *)local_4d8);
        if ((anon_struct_8_2_bfd9d0cb_for_basic)local_4d8._8_8_ !=
            (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
          operator_delete((void *)local_4d8._8_8_,local_4c8._8_8_ - local_4d8._8_8_);
        }
        if (!bVar18) break;
        uVar30 = local_4f8.field_2._M_allocated_capacity;
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  ((VarType *)local_448,(glu *)&pVVar35->type,(VarType *)local_4f8._M_string_length,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )local_4f8.field_2._M_allocated_capacity,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )in_R8);
        getAttributeName_abi_cxx11_
                  ((string *)local_490,pTVar8,(char *)&local_4f8._M_string_length,
                   (TypeComponentVector *)uVar30);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"in ",3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_468,(char *)local_490._0_8_,(allocator<char> *)&local_3a0);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_4d8,(VarType *)local_448,(string *)local_468,0);
        poVar22 = glu::decl::operator<<((ostream *)local_1b8,(DeclareVariable *)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._8_8_ != local_4b0) {
          operator_delete((void *)local_4c8._8_8_,local_4b0[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._0_8_ != &local_458) {
          operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._0_8_ != &local_480) {
          operator_delete((void *)local_490._0_8_,local_480._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_448);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_3c8,
                   (SubTypeIterator<glu::IsVectorOrScalarType> *)&local_4f8,0);
        if ((pointer)local_3c8._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_3c8._8_8_,(long)local_3b0 - local_3c8._8_8_);
        }
      }
      if ((VarType *)local_4f8._M_string_length != (VarType *)0x0) {
        operator_delete((void *)local_4f8._M_string_length,
                        local_4f8.field_2._8_8_ - local_4f8._M_string_length);
      }
      pVVar35 = pVVar35 + 1;
    } while (pVVar35 !=
             (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_360 = &this->m_progSpec;
  iVar19 = 0;
  do {
    pcVar41 = "in";
    if (iVar19 == 0) {
      pcVar41 = "out";
    }
    poVar22 = (ostream *)local_340;
    if (iVar19 == 0) {
      poVar22 = (ostream *)local_1b8;
    }
    for (ppSVar32 = (this->m_progSpec).m_structs.
                    super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppSVar32 !=
        (this->m_progSpec).m_structs.
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppSVar32 = ppSVar32 + 1) {
      if (((*ppSVar32)->m_typeName)._M_string_length != 0) {
        local_4d8._8_8_ = local_4d8._8_8_ & 0xffffffff00000000;
        local_4d8._0_8_ = *ppSVar32;
        poVar23 = glu::decl::operator<<(poVar22,(DeclareStructTypePtr *)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,";\n",2);
      }
    }
    pVVar35 = (this->m_progSpec).m_varyings.
              super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pVVar35 !=
        (this->m_progSpec).m_varyings.
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        IVar5 = pVVar35->interpolation;
        if (IVar5 == INTERPOLATION_SMOOTH) {
          bVar18 = false;
          pcVar33 = "smooth";
        }
        else if (IVar5 == INTERPOLATION_CENTROID) {
          bVar18 = false;
          pcVar33 = "centroid";
        }
        else if (IVar5 == INTERPOLATION_FLAT) {
          bVar18 = false;
          pcVar33 = "flat";
        }
        else {
          bVar18 = true;
          pcVar33 = (char *)0x0;
        }
        if (bVar18) {
          std::ios::clear((int)poVar22 + (int)poVar22->_vptr_basic_ostream[-3]);
        }
        else {
          sVar24 = strlen(pcVar33);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,pcVar33,sVar24);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,pcVar41,(ulong)(iVar19 == 0) + 2)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,(pVVar35->name)._M_dataplus._M_p,
                   (allocator<char> *)local_490);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_4d8,&pVVar35->type,&local_4f8,0);
        poVar23 = glu::decl::operator<<(poVar22,(DeclareVariable *)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._8_8_ != local_4b0) {
          operator_delete((void *)local_4c8._8_8_,local_4b0[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,
                          (ulong)(local_4f8.field_2._M_allocated_capacity + 1));
        }
        pVVar35 = pVVar35 + 1;
      } while (pVVar35 !=
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar18 = iVar19 == 0;
    iVar19 = iVar19 + 1;
  } while (bVar18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\nvoid main (void)\n{\n",0x14);
  pbVar7 = local_3d0;
  uVar30 = _local_3d8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\thighp vec4 res = vec4(0.0);\n",0x1d);
  if ((pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30) ||
     (local_3a8 == 0)) {
    pcVar41 = "\tgl_PointSize = 1.0;\n";
    if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30) {
      pcVar41 = "\tgl_PointSize = a_pointSize;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,pcVar41,
               (ulong)(pbVar7 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30) *
               8 + 0x15);
  }
  pVVar35 = (this->m_progSpec).m_varyings.
            super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar35 !=
      (this->m_progSpec).m_varyings.
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    varyingName = (anon_struct_8_2_bfd9d0cb_for_basic)((long)local_4d8 + 8);
    do {
      pTVar8 = (TransformFeedback *)(pVVar35->name)._M_dataplus._M_p;
      glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_4d8,&pVVar35->type);
      while( true ) {
        local_4f8.field_2._M_allocated_capacity = 0;
        local_4f8.field_2._8_8_ = 0;
        local_4f8._M_dataplus._M_p = (char *)0x0;
        local_4f8._M_string_length = 0;
        bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                           ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_4d8,
                            (SubTypeIterator<glu::IsVectorOrScalarType> *)&local_4f8);
        if ((VarType *)local_4f8._M_string_length != (VarType *)0x0) {
          operator_delete((void *)local_4f8._M_string_length,
                          local_4f8.field_2._8_8_ - local_4f8._M_string_length);
        }
        if (!bVar18) break;
        pVVar31 = (VarTypeComponent *)local_4c8._0_8_;
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  ((VarType *)local_468,(glu *)&pVVar35->type,(VarType *)local_4d8._8_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )local_4c8._0_8_,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )in_R8);
        getAttributeName_abi_cxx11_
                  (&local_4f8,pTVar8,(char *)varyingName,(TypeComponentVector *)pVVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\t",1);
        if (pTVar8 == (TransformFeedback *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffae8 +
                          (int)*(_func_int **)((long)local_1b8 + -0x18) + 0x360);
        }
        else {
          sVar24 = strlen((char *)pTVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,(char *)pTVar8,sVar24);
        }
        local_448._0_8_ = local_4d8._0_8_;
        local_448._8_8_ = varyingName;
        glu::operator<<((ostream *)local_1b8,(TypeAccessFormat *)local_448);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8," = ",3);
        poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b8,local_4f8._M_dataplus._M_p,
                             local_4f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,";\n",2);
        iVar19 = glu::getDataTypeScalarSize(local_468._8_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\tres += ",8);
        switch(iVar19) {
        case 1:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"vec4(",5);
          if (pTVar8 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffae8 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_340 + -0x20))->_M_string_length + 0x1d8);
          }
          else {
            sVar24 = strlen((char *)pTVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_340,(char *)pTVar8,sVar24);
          }
          local_448._0_8_ = local_4d8._0_8_;
          local_448._8_8_ = varyingName;
          glu::operator<<((ostream *)local_340,(TypeAccessFormat *)local_448);
          goto LAB_01180288;
        case 2:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"vec2(",5);
          if (pTVar8 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffae8 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_340 + -0x20))->_M_string_length + 0x1d8);
          }
          else {
            sVar24 = strlen((char *)pTVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_340,(char *)pTVar8,sVar24);
          }
          local_448._0_8_ = local_4d8._0_8_;
          local_448._8_8_ = varyingName;
          glu::operator<<((ostream *)local_340,(TypeAccessFormat *)local_448);
          lVar34 = 6;
          pcVar41 = ").xxyy";
          break;
        case 3:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"vec3(",5);
          if (pTVar8 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffae8 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_340 + -0x20))->_M_string_length + 0x1d8);
          }
          else {
            sVar24 = strlen((char *)pTVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_340,(char *)pTVar8,sVar24);
          }
          local_448._0_8_ = local_4d8._0_8_;
          local_448._8_8_ = varyingName;
          glu::operator<<((ostream *)local_340,(TypeAccessFormat *)local_448);
          lVar34 = 6;
          pcVar41 = ").xyzx";
          break;
        case 4:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"vec4(",5);
          if (pTVar8 == (TransformFeedback *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffae8 +
                            (int)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)local_340 + -0x20))->_M_string_length + 0x1d8);
          }
          else {
            sVar24 = strlen((char *)pTVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_340,(char *)pTVar8,sVar24);
          }
          local_448._0_8_ = local_4d8._0_8_;
          local_448._8_8_ = varyingName;
          glu::operator<<((ostream *)local_340,(TypeAccessFormat *)local_448);
LAB_01180288:
          lVar34 = 1;
          pcVar41 = ")";
          break;
        default:
          goto switchD_011800be_default;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar41,lVar34);
switchD_011800be_default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,
                          (ulong)(local_4f8.field_2._M_allocated_capacity + 1));
        }
        glu::VarType::~VarType((VarType *)local_468);
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_490,
                   (SubTypeIterator<glu::IsVectorOrScalarType> *)local_4d8,0);
        pvVar16 = (void *)CONCAT44(local_490._12_4_,local_490._8_4_);
        if (pvVar16 != (void *)0x0) {
          operator_delete(pvVar16,local_480._8_8_ - (long)pvVar16);
        }
      }
      if ((anon_struct_8_2_bfd9d0cb_for_basic)local_4d8._8_8_ !=
          (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
        operator_delete((void *)local_4d8._8_8_,local_4c8._8_8_ - local_4d8._8_8_);
      }
      pVVar35 = pVVar35 + 1;
    } while (pVVar35 !=
             (this->m_progSpec).m_varyings.
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\to_color = res * u_scale + u_bias;\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_380,(string *)local_4d8);
  if ((StructType *)local_4d8._0_8_ != (StructType *)local_4c8) {
    operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_418,(string *)local_4d8);
  if ((StructType *)local_4d8._0_8_ != (StructType *)local_4c8) {
    operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  std::ios_base::~ios_base(local_2d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  pSVar25 = (ShaderProgram *)operator_new(0xd0);
  local_108[0x10] = 0;
  local_108._17_8_ = 0;
  local_108._0_8_ = (pointer)0x0;
  local_108[8] = 0;
  local_108._9_7_ = 0;
  memset(local_1b8,0,0xac);
  local_340 = (undefined1  [8])((ulong)(uint)local_340._4_4_ << 0x20);
  auStack_338 = (undefined1  [8])abStack_328;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_338,local_380._0_8_,
             (undefined1 *)((long)(Type *)local_380._8_8_ + local_380._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b8 + ((ulong)local_340 & 0xffffffff) * 0x18),(value_type *)auStack_338);
  local_4d8._0_4_ = 1;
  local_4d8._8_8_ = (VarType *)(local_4c8 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4d8 + 8),local_418,
             (undefined1 *)((long)&(local_418->m_name)._M_dataplus._M_p + local_410));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b8 + (local_4d8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4d8 + 8));
  pvVar9 = (this->m_progSpec).m_transformFeedbackVaryings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->m_progSpec).m_transformFeedbackVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; pvVar9 != __x; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108,__x);
  }
  local_110 = local_3a4;
  glu::ShaderProgram::ShaderProgram(pSVar25,local_1c8,(ProgramSources *)local_1b8);
  if ((VarType *)local_4d8._8_8_ != (VarType *)(local_4c8 + 8)) {
    operator_delete((void *)local_4d8._8_8_,(ulong)(local_4c8._8_8_ + 1));
  }
  if (auStack_338 != (undefined1  [8])abStack_328) {
    operator_delete((void *)auStack_338,
                    CONCAT44(abStack_328[0]._M_dataplus._M_p._4_4_,
                             CONCAT13(abStack_328[0]._M_dataplus._M_p._3_1_,
                                      CONCAT12(abStack_328[0]._M_dataplus._M_p._2_1_,
                                               abStack_328[0]._M_dataplus._M_p._0_2_))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_108);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_128);
  lVar34 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b8 + lVar34));
    lVar34 = lVar34 + -0x18;
  } while (lVar34 != -0x18);
  if (local_418 != (pointer)local_408) {
    operator_delete(local_418,(ulong)(local_408._0_8_ + 1));
  }
  paVar37 = local_428;
  if ((VarType *)local_380._0_8_ != (VarType *)(local_380 + 0x10)) {
    operator_delete((void *)local_380._0_8_,CONCAT71(uStack_36f,local_380[0x10]) + 1);
  }
  this->m_program = pSVar25;
  glu::operator<<((TestLog *)&paVar37->_M_allocated_capacity,pSVar25);
  pSVar25 = this->m_program;
  if ((pSVar25->m_program).m_info.linkOk != false) {
    local_1b8 = (undefined1  [8])paVar37;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_1b0,"Transform feedback varyings: ",0x1d);
    local_340 = (undefined1  [8])
                (this->m_progSpec).m_transformFeedbackVaryings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    auStack_338 = (undefined1  [8])
                  (this->m_progSpec).m_transformFeedbackVaryings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    tcu::Format::operator<<
              ((ostream *)&pbStack_1b0,
               (Array<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_340);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1b0);
    std::ios_base::~ios_base(local_140);
    local_1b8 = (undefined1  [8])local_428;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_1b0,"Transform feedback varyings reported by compiler:",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1b0);
    std::ios_base::~ios_base(local_140);
    pFVar17 = local_420;
    GVar6 = (this->m_program->m_program).m_program;
    local_4f8._M_dataplus._M_p = local_4f8._M_dataplus._M_p & 0xffffffff00000000;
    local_490._0_8_ = (ulong)(uint)local_490._4_4_ << 0x20;
    (*local_420->getProgramiv)(GVar6,0x8c83,(GLint *)&local_4f8);
    (*pFVar17->getProgramiv)(GVar6,0x8c76,(GLint *)local_490);
    GVar20 = (*pFVar17->getError)();
    glu::checkError(GVar20,"Query TF varyings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x338);
    local_1b8 = (undefined1  [8])local_428;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pbStack_1b0,"GL_TRANSFORM_FEEDBACK_VARYINGS = ",0x21);
    std::ostream::operator<<((ostringstream *)&pbStack_1b0,(int)local_4f8._M_dataplus._M_p);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1b0);
    std::ios_base::~ios_base(local_140);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_4d8,
               (long)(int)(local_490._0_4_ + TYPE_ARRAY),(allocator_type *)local_1b8);
    if (0 < (int)local_4f8._M_dataplus._M_p) {
      pSVar3 = (StructType *)(local_448 + 0x10);
      GVar42 = 0;
      do {
        local_468._0_8_ = local_468._0_8_ & 0xffffffff00000000;
        local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
        in_R8 = (anon_struct_8_2_bfd9d0cb_for_basic)local_468;
        (*local_420->getTransformFeedbackVarying)
                  (GVar6,GVar42,local_4d8._8_4_ - (int)local_4d8._0_8_,(GLsizei *)0x0,
                   (GLsizei *)in_R8,(GLenum *)local_3c8,(GLchar *)local_4d8._0_8_);
        GVar20 = (*local_420->getError)();
        glu::checkError(GVar20,"glGetTransformFeedbackVarying()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                        ,0x344);
        dataType = glu::getDataTypeFromGLType(local_3c8._0_4_);
        if (dataType == TYPE_LAST) {
          local_448._16_8_ = (char *)0x286e776f6e6b6e75;
          local_448._8_4_ = TYPE_FLOAT_MAT3X2;
          local_448._12_4_ = PRECISION_LOWP;
          local_430 = 0;
          local_1b8 = (undefined1  [8])(local_3c8._0_8_ & 0xffffffff);
          local_448._0_8_ = pSVar3;
          tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_3a0,local_1b8);
          pcVar41 = (char *)0xf;
          if ((StructType *)local_448._0_8_ != pSVar3) {
            pcVar41 = (char *)local_448._16_8_;
          }
          pcVar33 = (char *)((long)(Type *)local_448._8_8_ + local_3a0._M_string_length);
          in_R8 = (anon_struct_8_2_bfd9d0cb_for_basic)local_448._8_8_;
          if (pcVar41 < pcVar33) {
            uVar30 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              uVar30 = local_3a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 < pcVar33) goto LAB_011809dc;
            plVar26 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_3a0,0,(char *)0x0,local_448._0_8_);
          }
          else {
LAB_011809dc:
            plVar26 = (long *)std::__cxx11::string::_M_append
                                        (local_448,(ulong)local_3a0._M_dataplus._M_p);
          }
          local_418 = (pointer)local_408;
          pSVar1 = (pointer)(plVar26 + 2);
          if ((pointer)*plVar26 == pSVar1) {
            local_408._0_8_ = (pSVar1->m_name)._M_dataplus._M_p;
            local_408._8_8_ = plVar26[3];
          }
          else {
            local_408._0_8_ = (pSVar1->m_name)._M_dataplus._M_p;
            local_418 = (pointer)*plVar26;
          }
          local_410 = plVar26[1];
          *plVar26 = (long)pSVar1;
          plVar26[1] = 0;
          *(undefined1 *)&(pSVar1->m_name)._M_dataplus._M_p = 0;
          plVar26 = (long *)std::__cxx11::string::append((char *)&local_418);
          local_340 = (undefined1  [8])local_330;
          pbVar27 = (pointer)(plVar26 + 2);
          if ((pointer)*plVar26 == pbVar27) {
            pcVar10 = (pbVar27->_M_dataplus)._M_p;
            lVar34 = plVar26[3];
            local_330._0_7_ = SUB87(pcVar10,0);
            local_330[7] = (undefined1)((ulong)pcVar10 >> 0x38);
            abStack_328[0]._M_dataplus._M_p._0_2_ = (undefined2)lVar34;
            abStack_328[0]._M_dataplus._M_p._2_1_ = (undefined1)((ulong)lVar34 >> 0x10);
            abStack_328[0]._M_dataplus._M_p._3_1_ = (undefined1)((ulong)lVar34 >> 0x18);
            abStack_328[0]._M_dataplus._M_p._4_4_ = (undefined4)((ulong)lVar34 >> 0x20);
          }
          else {
            pcVar10 = (pbVar27->_M_dataplus)._M_p;
            local_330._0_7_ = SUB87(pcVar10,0);
            local_330[7] = (undefined1)((ulong)pcVar10 >> 0x38);
            local_340 = (undefined1  [8])*plVar26;
          }
          auStack_338 = (undefined1  [8])plVar26[1];
          *plVar26 = (long)pbVar27;
          plVar26[1] = 0;
          *(undefined1 *)(plVar26 + 2) = 0;
        }
        else {
          pcVar41 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_340,pcVar41,&local_469)
          ;
        }
        if (dataType == TYPE_LAST) {
          if (local_418 != (pointer)local_408) {
            operator_delete(local_418,(ulong)(local_408._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,
                            (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
          }
        }
        if ((dataType == TYPE_LAST) && ((StructType *)local_448._0_8_ != pSVar3)) {
          operator_delete((void *)local_448._0_8_,(ulong)(local_448._16_8_ + 1));
        }
        local_1b8 = (undefined1  [8])local_428;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_1b0);
        uVar30 = local_4d8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)(ostringstream *)&pbStack_1b0 + (int)pbStack_1b0[-1]._M_string_length
                         );
        }
        else {
          sVar24 = strlen((char *)local_4d8._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pbStack_1b0,(char *)uVar30,sVar24);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_1b0,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pbStack_1b0,(char *)local_340,(long)auStack_338);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_1b0,"[",1);
        std::ostream::operator<<((ostringstream *)&pbStack_1b0,local_468._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pbStack_1b0,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_1b0);
        std::ios_base::~ios_base(local_140);
        if (local_340 != (undefined1  [8])local_330) {
          operator_delete((void *)local_340,CONCAT17(local_330[7],local_330._0_7_) + 1);
        }
        GVar42 = GVar42 + 1;
      } while ((int)GVar42 < (int)local_4f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_4d8._0_8_,local_4c8._0_8_ - local_4d8._0_8_);
    }
    _Var21 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[13]>>
                       ((this->m_progSpec).m_transformFeedbackVaryings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->m_progSpec).m_transformFeedbackVaryings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"gl_PointSize");
    pbVar7 = (this->m_progSpec).m_transformFeedbackVaryings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this->m_inputStride = 0;
    local_330._0_7_ = 0x7469736f705f61;
    local_330[7] = 'i';
    abStack_328[0]._M_dataplus._M_p._0_2_ = 0x6e6f;
    auStack_338 = (undefined1  [8])0xa;
    abStack_328[0]._M_dataplus._M_p._2_1_ = '\0';
    local_340 = (undefined1  [8])local_330;
    glu::VarType::VarType((VarType *)local_4d8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    Attribute::Attribute
              ((Attribute *)local_1b8,(string *)local_340,(VarType *)local_4d8,this->m_inputStride);
    this_00 = &this->m_attributes;
    std::
    vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
    ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
              (this_00,(Attribute *)local_1b8);
    glu::VarType::~VarType(local_198);
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
    }
    glu::VarType::~VarType((VarType *)local_4d8);
    if (local_340 != (undefined1  [8])local_330) {
      operator_delete((void *)local_340,CONCAT17(local_330[7],local_330._0_7_) + 1);
    }
    this->m_inputStride = this->m_inputStride + 0x10;
    if (_Var21._M_current != pbVar7) {
      local_330._0_7_ = 0x746e696f705f61;
      local_330[7] = 'S';
      abStack_328[0]._M_dataplus._M_p._0_2_ = 0x7a69;
      abStack_328[0]._M_dataplus._M_p._2_1_ = 'e';
      auStack_338 = (undefined1  [8])0xb;
      abStack_328[0]._M_dataplus._M_p._3_1_ = '\0';
      local_340 = (undefined1  [8])local_330;
      glu::VarType::VarType((VarType *)local_4d8,TYPE_FLOAT,PRECISION_HIGHP);
      Attribute::Attribute
                ((Attribute *)local_1b8,(string *)local_340,(VarType *)local_4d8,this->m_inputStride
                );
      std::
      vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
                (this_00,(Attribute *)local_1b8);
      glu::VarType::~VarType(local_198);
      if (local_1b8 != (undefined1  [8])&local_1a8) {
        operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      glu::VarType::~VarType((VarType *)local_4d8);
      if (local_340 != (undefined1  [8])local_330) {
        operator_delete((void *)local_340,CONCAT17(local_330[7],local_330._0_7_) + 1);
      }
      this->m_inputStride = this->m_inputStride + 4;
    }
    pVVar35 = (this->m_progSpec).m_varyings.
              super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pVVar35 !=
        (this->m_progSpec).m_varyings.
        super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                  ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_340,&pVVar35->type);
        while( true ) {
          local_1a8._M_allocated_capacity = 0;
          local_1a8._8_8_ = (pointer)0x0;
          local_1b8 = (undefined1  [8])0x0;
          pbStack_1b0 = (pointer)0x0;
          bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                             ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_340,
                              (SubTypeIterator<glu::IsVectorOrScalarType> *)local_1b8);
          if (pbStack_1b0 != (pointer)0x0) {
            operator_delete(pbStack_1b0,local_1a8._8_8_ - (long)pbStack_1b0);
          }
          if (!bVar18) break;
          begin._M_current._7_1_ = local_330[7];
          begin._M_current._0_7_ = local_330._0_7_;
          glu::
          getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                    ((VarType *)local_490,(glu *)local_340,(VarType *)auStack_338,begin,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )in_R8);
          getAttributeName_abi_cxx11_
                    ((string *)local_4d8,(TransformFeedback *)(pVVar35->name)._M_dataplus._M_p,
                     auStack_338,(TypeComponentVector *)begin._M_current);
          Attribute::Attribute
                    ((Attribute *)local_1b8,(string *)local_4d8,(VarType *)local_490,
                     this->m_inputStride);
          std::
          vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
          ::emplace_back<deqp::gles3::Functional::TransformFeedback::Attribute>
                    (this_00,(Attribute *)local_1b8);
          glu::VarType::~VarType(local_198);
          if (local_1b8 != (undefined1  [8])&local_1a8) {
            operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
          }
          iVar19 = glu::getDataTypeScalarSize(local_490._8_4_);
          this->m_inputStride = this->m_inputStride + iVar19 * 4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8) {
            operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
          }
          glu::VarType::~VarType((VarType *)local_490);
          glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                    ((SubTypeIterator<glu::IsVectorOrScalarType> *)&local_4f8,
                     (SubTypeIterator<glu::IsVectorOrScalarType> *)local_340,0);
          if ((VarType *)local_4f8._M_string_length != (VarType *)0x0) {
            operator_delete((void *)local_4f8._M_string_length,
                            local_4f8.field_2._8_8_ - local_4f8._M_string_length);
          }
        }
        if (auStack_338 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_338,
                          CONCAT44(abStack_328[0]._M_dataplus._M_p._4_4_,
                                   CONCAT13(abStack_328[0]._M_dataplus._M_p._3_1_,
                                            CONCAT12(abStack_328[0]._M_dataplus._M_p._2_1_,
                                                     abStack_328[0]._M_dataplus._M_p._0_2_))) -
                          (long)auStack_338);
        }
        pVVar35 = pVVar35 + 1;
      } while (pVVar35 !=
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &this->m_transformFeedbackOutputs;
    local_3d8 = this->m_bufferMode;
    std::
    vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
    ::resize((vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
              *)local_3d0,
             (long)(this->m_progSpec).m_transformFeedbackVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_progSpec).m_transformFeedbackVaryings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    pbVar27 = (this->m_progSpec).m_transformFeedbackVaryings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_progSpec).m_transformFeedbackVaryings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27) >> 5)) {
      lVar34 = 0;
      paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      do {
        pbVar27 = pbVar27 + lVar34;
        iVar19 = 0;
        if (local_3d8 == 0x8c8d) {
          iVar19 = (int)lVar34;
        }
        iVar40 = (int)paVar37;
        if (local_3d8 == 0x8c8d) {
          iVar40 = 0;
        }
        pOVar11 = (((_Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                     *)&local_3d0->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
        pOVar36 = pOVar11 + lVar34;
        local_428 = paVar37;
        std::__cxx11::string::_M_assign((string *)pOVar36);
        pOVar11[lVar34].bufferNdx = iVar19;
        pOVar11[lVar34].offset = iVar40;
        iVar19 = std::__cxx11::string::compare((char *)pbVar27);
        if (iVar19 == 0) {
          _Var29._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
          _Var12._M_current =
               (this->m_attributes).
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_340 = (undefined1  [8])local_330;
          local_330._0_7_ = 0x7469736f705f61;
          local_330[7] = 'i';
          abStack_328[0]._M_dataplus._M_p._0_2_ = 0x6e6f;
          auStack_338 = (undefined1  [8])0xa;
          abStack_328[0]._M_dataplus._M_p._2_1_ = '\0';
          local_1b8 = (undefined1  [8])&local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,local_340,
                     (undefined1 *)((long)&abStack_328[0]._M_dataplus._M_p + 2));
          _Var29 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                             (_Var29,_Var12,(AttributeNameEquals *)local_1b8);
          uVar30 = local_1a8._M_allocated_capacity;
          auVar39 = local_1b8;
          if (local_1b8 != (undefined1  [8])&local_1a8) {
LAB_011815f3:
            operator_delete((void *)auVar39,
                            (ulong)((long)&(((pointer)uVar30)->_M_dataplus)._M_p + 1));
          }
LAB_011815fb:
          if (local_340 != (undefined1  [8])local_330) {
            operator_delete((void *)local_340,CONCAT17(local_330[7],local_330._0_7_) + 1);
          }
          local_490._0_8_ = _Var29._M_current;
          glu::VarType::operator=(&pOVar36->type,&(_Var29._M_current)->type);
          iVar13._M_current =
               (pOVar36->inputs).
               super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar13._M_current ==
              (pOVar36->inputs).
              super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
            ::_M_realloc_insert<deqp::gles3::Functional::TransformFeedback::Attribute_const*const&>
                      ((vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
                        *)&pOVar36->inputs,iVar13,(Attribute **)local_490);
          }
          else {
            *iVar13._M_current = (Attribute *)local_490._0_8_;
            pppAVar2 = &(pOVar36->inputs).
                        super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppAVar2 = *pppAVar2 + 1;
          }
        }
        else {
          iVar19 = std::__cxx11::string::compare((char *)pbVar27);
          if (iVar19 == 0) {
            _Var29._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var12._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_330._0_7_ = 0x746e696f705f61;
            local_330[7] = 'S';
            abStack_328[0]._M_dataplus._M_p._0_2_ = 0x7a69;
            abStack_328[0]._M_dataplus._M_p._2_1_ = 'e';
            auStack_338 = (undefined1  [8])0xb;
            abStack_328[0]._M_dataplus._M_p._3_1_ = '\0';
            local_4d8._0_8_ = local_4c8;
            local_340 = (undefined1  [8])local_330;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,(undefined1 *)((long)&abStack_328[0]._M_dataplus._M_p + 3));
            _Var29 = std::
                     find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                               (_Var29,_Var12,(AttributeNameEquals *)local_4d8);
            uVar30 = local_4c8._0_8_;
            auVar39 = (undefined1  [8])local_4d8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8) goto LAB_011815f3;
            goto LAB_011815fb;
          }
          glu::parseVariableName_abi_cxx11_
                    ((string *)local_340,(glu *)(pbVar27->_M_dataplus)._M_p,nameWithPath);
          _Var28._M_current =
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               (this->m_progSpec).m_varyings.
               super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4f8,local_340,
                     (glu *)((long)&((_Alloc_hider *)auStack_338)->_M_p + (long)local_340));
          _Var28 = std::
                   find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Varying_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Varying,std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>>>,deqp::gles3::Functional::TransformFeedback::VaryingNameEquals>
                             (_Var28,__last,(VaryingNameEquals *)&local_4f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            (ulong)(local_4f8.field_2._M_allocated_capacity + 1));
          }
          local_408._16_8_ = (VarType *)0x0;
          local_408._24_8_ = (VarTypeComponent *)0x0;
          local_3e8 = 0;
          glu::parseTypePath((pbVar27->_M_dataplus)._M_p,&(_Var28._M_current)->type,
                             (TypeComponentVector *)(local_408 + 0x10));
          pVVar31 = (VarTypeComponent *)local_408._24_8_;
          glu::
          getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                    ((VarType *)local_490,(glu *)&(_Var28._M_current)->type,
                     (VarType *)local_408._16_8_,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )local_408._24_8_,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )in_R8);
          glu::VarType::operator=(&pOVar36->type,(VarType *)local_490);
          glu::VarType::~VarType((VarType *)local_490);
          glu::SubTypeIterator<glu::IsVectorOrScalarType>::SubTypeIterator
                    ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_490,&pOVar36->type);
          while( true ) {
            local_458._M_allocated_capacity = 0;
            local_458._8_8_ = 0;
            local_468._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_468._8_4_ = TYPE_INVALID;
            local_468._12_4_ = PRECISION_LOWP;
            bVar18 = glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator!=
                               ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_490,
                                (SubTypeIterator<glu::IsVectorOrScalarType> *)local_468);
            if ((anon_struct_8_2_bfd9d0cb_for_basic)local_468._8_8_ !=
                (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
              operator_delete((void *)local_468._8_8_,local_458._8_8_ - local_468._8_8_);
            }
            if (!bVar18) break;
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector
                      (&local_358,
                       ((long)(local_480._M_allocated_capacity -
                              CONCAT44(local_490._12_4_,local_490._8_4_)) >> 3) +
                       ((long)(local_408._24_8_ - local_408._16_8_) >> 3),
                       (allocator_type *)local_468);
            if (local_408._24_8_ - local_408._16_8_ != 0) {
              memmove(local_358.
                      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                      ._M_impl.super__Vector_impl_data._M_start,(void *)local_408._16_8_,
                      local_408._24_8_ - local_408._16_8_);
            }
            sVar24 = local_480._M_allocated_capacity -
                     (long)CONCAT44(local_490._12_4_,local_490._8_4_);
            if (sVar24 != 0) {
              memmove((void *)((local_408._24_8_ - local_408._16_8_) +
                              (long)local_358.
                                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                    ._M_impl.super__Vector_impl_data._M_start),
                      (void *)CONCAT44(local_490._12_4_,local_490._8_4_),sVar24);
            }
            getAttributeName_abi_cxx11_
                      ((string *)local_468,(TransformFeedback *)local_340,(char *)&local_358,
                       (TypeComponentVector *)pVVar31);
            _Var29._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var12._M_current =
                 (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_3c8._0_8_ = local_3c8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3c8,local_468._0_8_,
                       (pointer)((long)(Type *)local_468._8_8_ + local_468._0_8_));
            _Var29 = std::
                     find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                               (_Var29,_Var12,(AttributeNameEquals *)local_3c8);
            if ((VarType *)local_3c8._0_8_ != (VarType *)(local_3c8 + 0x10)) {
              operator_delete((void *)local_3c8._0_8_,(ulong)((long)(Type *)local_3c8._16_8_ + 1));
            }
            iVar13._M_current =
                 (pOVar36->inputs).
                 super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_1c0 = _Var29._M_current;
            if (iVar13._M_current ==
                (pOVar36->inputs).
                super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
              ::
              _M_realloc_insert<deqp::gles3::Functional::TransformFeedback::Attribute_const*const&>
                        ((vector<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute_const*>>
                          *)&pOVar36->inputs,iVar13,&local_1c0);
            }
            else {
              *iVar13._M_current = _Var29._M_current;
              pppAVar2 = &(pOVar36->inputs).
                          super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppAVar2 = *pppAVar2 + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._0_8_ != &local_458) {
              operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
            }
            if (local_358.
                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_358.
                              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_358.
                                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_358.
                                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            glu::SubTypeIterator<glu::IsVectorOrScalarType>::operator++
                      ((SubTypeIterator<glu::IsVectorOrScalarType> *)local_380,
                       (SubTypeIterator<glu::IsVectorOrScalarType> *)local_490,0);
            if ((pointer)local_380._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_380._8_8_,(long)local_368 - local_380._8_8_);
            }
          }
          pvVar16 = (void *)CONCAT44(local_490._12_4_,local_490._8_4_);
          if (pvVar16 != (void *)0x0) {
            operator_delete(pvVar16,local_480._8_8_ - (long)pvVar16);
          }
          if ((VarType *)local_408._16_8_ != (VarType *)0x0) {
            operator_delete((void *)local_408._16_8_,local_3e8 - local_408._16_8_);
          }
          if (local_340 != (undefined1  [8])local_330) {
            operator_delete((void *)local_340,CONCAT17(local_330[7],local_330._0_7_) + 1);
          }
        }
        iVar19 = glu::VarType::getScalarSize(&pOVar36->type);
        paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)(uint)((int)local_428 + iVar19 * 4);
        lVar34 = lVar34 + 1;
        pbVar27 = (this->m_progSpec).m_transformFeedbackVaryings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar34 < (int)((ulong)((long)(this->m_progSpec).m_transformFeedbackVaryings.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pbVar27) >> 5));
    }
    if (this->m_bufferMode == 0x8c8d) {
      pOVar36 = (this->m_transformFeedbackOutputs).
                super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar36 !=
          (this->m_transformFeedbackOutputs).
          super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          iVar19 = glu::VarType::getScalarSize(&pOVar36->type);
          local_1b8._0_4_ = iVar19 << 2;
          iVar14._M_current =
               (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar14._M_current ==
              (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->m_bufferStrides,iVar14,(int *)local_1b8);
          }
          else {
            *iVar14._M_current = iVar19 << 2;
            (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar14._M_current + 1;
          }
          pOVar36 = pOVar36 + 1;
        } while (pOVar36 !=
                 (this->m_transformFeedbackOutputs).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
      for (pOVar36 = (this->m_transformFeedbackOutputs).
                     super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pOVar36 !=
          (this->m_transformFeedbackOutputs).
          super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
          ._M_impl.super__Vector_impl_data._M_finish; pOVar36 = pOVar36 + 1) {
        iVar19 = glu::VarType::getScalarSize(&pOVar36->type);
        local_1b8._0_4_ = local_1b8._0_4_ + iVar19 * 4;
      }
      iVar14._M_current =
           (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_bufferStrides,iVar14,(int *)local_1b8
                  );
      }
      else {
        *iVar14._M_current = local_1b8._0_4_;
        (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_outputBuffers,
               (long)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    pGVar15 = (this->m_outputBuffers).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*local_420->genBuffers)
              ((GLsizei)((ulong)((long)(this->m_outputBuffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar15)
                        >> 2),pGVar15);
    this_01 = (ObjectWrapper *)operator_new(0x18);
    iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
    glu::ObjectWrapper::ObjectWrapper(this_01,(Functions *)CONCAT44(extraout_var_00,iVar19),traits);
    this->m_transformFeedback = (TransformFeedback *)this_01;
    GVar20 = (*local_420->getError)();
    glu::checkError(GVar20,"init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x3d4);
    this->m_iterNdx = 0;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  if (((((*pSVar25->m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true) &&
      (((*pSVar25->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk == true)) &&
     ((pSVar25->m_program).m_info.linkOk == false)) {
    bVar18 = isProgramSupported(local_420,local_360,this->m_bufferMode);
    if (bVar18) {
      bVar18 = hasArraysInTFVaryings(local_360);
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      if (!bVar18) {
        tcu::TestError::TestError
                  ((TestError *)this_02,"Link failed",glcts::fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                   ,0x3aa);
        goto LAB_011818c8;
      }
      tcu::NotSupportedError::NotSupportedError
                (this_02,"Capturing arrays is not supported (undefined in specification)",
                 glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                 ,0x3a8);
    }
    else {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"Implementation limits execeeded",glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                 ,0x3a6);
    }
    ppuVar38 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_02,"Compile failed",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
               ,0x3ad);
LAB_011818c8:
    ppuVar38 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_02,ppuVar38,tcu::Exception::~Exception);
}

Assistant:

void TransformFeedbackCase::init (void)
{
	TestLog&				log	= m_testCtx.getLog();
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	DE_ASSERT(!m_program);
	m_program = createVertexCaptureProgram(m_context.getRenderContext(), m_progSpec, m_bufferMode, m_primitiveType);

	log << *m_program;
	if (!m_program->isOk())
	{
		const bool linkFail = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX).compileOk &&
							  m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk &&
							  !m_program->getProgramInfo().linkOk;

		if (linkFail)
		{
			if (!isProgramSupported(gl, m_progSpec, m_bufferMode))
				throw tcu::NotSupportedError("Implementation limits execeeded", "", __FILE__, __LINE__);
			else if (hasArraysInTFVaryings(m_progSpec))
				throw tcu::NotSupportedError("Capturing arrays is not supported (undefined in specification)", "", __FILE__, __LINE__);
			else
				throw tcu::TestError("Link failed", "", __FILE__, __LINE__);
		}
		else
			throw tcu::TestError("Compile failed", "", __FILE__, __LINE__);
	}

	log << TestLog::Message << "Transform feedback varyings: " << tcu::formatArray(m_progSpec.getTransformFeedbackVaryings().begin(), m_progSpec.getTransformFeedbackVaryings().end()) << TestLog::EndMessage;

	// Print out transform feedback points reported by GL.
	log << TestLog::Message << "Transform feedback varyings reported by compiler:" << TestLog::EndMessage;
	logTransformFeedbackVaryings(log, gl, m_program->getProgram());

	// Compute input specification.
	computeInputLayout(m_attributes, m_inputStride, m_progSpec.getVaryings(), m_progSpec.isPointSizeUsed());

	// Build list of varyings used in transform feedback.
	computeTransformFeedbackOutputs(m_transformFeedbackOutputs, m_attributes, m_progSpec.getVaryings(), m_progSpec.getTransformFeedbackVaryings(), m_bufferMode);
	DE_ASSERT(!m_transformFeedbackOutputs.empty());

	// Buffer strides.
	DE_ASSERT(m_bufferStrides.empty());
	if (m_bufferMode == GL_SEPARATE_ATTRIBS)
	{
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			m_bufferStrides.push_back(outIter->type.getScalarSize()*(int)sizeof(deUint32));
	}
	else
	{
		int totalSize = 0;
		for (vector<Output>::const_iterator outIter = m_transformFeedbackOutputs.begin(); outIter != m_transformFeedbackOutputs.end(); outIter++)
			totalSize += outIter->type.getScalarSize()*(int)sizeof(deUint32);

		m_bufferStrides.push_back(totalSize);
	}

	// \note Actual storage is allocated in iterate().
	m_outputBuffers.resize(m_bufferStrides.size());
	gl.genBuffers((glw::GLsizei)m_outputBuffers.size(), &m_outputBuffers[0]);

	DE_ASSERT(!m_transformFeedback);
	m_transformFeedback = new glu::TransformFeedback(m_context.getRenderContext());

	GLU_EXPECT_NO_ERROR(gl.getError(), "init");

	m_iterNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}